

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cardinality_estimator.hpp
# Opt level: O1

void __thiscall
duckdb::RelationsToTDom::RelationsToTDom
          (RelationsToTDom *this,column_binding_set_t *column_binding_set)

{
  size_t sVar1;
  undefined4 uVar2;
  __alloc_node_gen_t __alloc_node_gen;
  _AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::ColumnBinding,_true>_>_> local_18;
  
  (this->equivalent_relations)._M_h._M_buckets = (__buckets_ptr)0x0;
  (this->equivalent_relations)._M_h._M_bucket_count = (column_binding_set->_M_h)._M_bucket_count;
  (this->equivalent_relations)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->equivalent_relations)._M_h._M_element_count = (column_binding_set->_M_h)._M_element_count;
  uVar2 = *(undefined4 *)&(column_binding_set->_M_h)._M_rehash_policy.field_0x4;
  sVar1 = (column_binding_set->_M_h)._M_rehash_policy._M_next_resize;
  (this->equivalent_relations)._M_h._M_rehash_policy._M_max_load_factor =
       (column_binding_set->_M_h)._M_rehash_policy._M_max_load_factor;
  *(undefined4 *)&(this->equivalent_relations)._M_h._M_rehash_policy.field_0x4 = uVar2;
  (this->equivalent_relations)._M_h._M_rehash_policy._M_next_resize = sVar1;
  (this->equivalent_relations)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_18._M_h = (__hashtable_alloc *)this;
  ::std::
  _Hashtable<duckdb::ColumnBinding,duckdb::ColumnBinding,std::allocator<duckdb::ColumnBinding>,std::__detail::_Identity,duckdb::ColumnBindingEquality,duckdb::ColumnBindingHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::
  _M_assign<std::_Hashtable<duckdb::ColumnBinding,duckdb::ColumnBinding,std::allocator<duckdb::ColumnBinding>,std::__detail::_Identity,duckdb::ColumnBindingEquality,duckdb::ColumnBindingHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::ColumnBinding,true>>>>
            ((_Hashtable<duckdb::ColumnBinding,duckdb::ColumnBinding,std::allocator<duckdb::ColumnBinding>,std::__detail::_Identity,duckdb::ColumnBindingEquality,duckdb::ColumnBindingHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)this,&column_binding_set->_M_h,&local_18);
  this->tdom_hll = 0;
  this->tdom_no_hll = 0xffffffffffffffff;
  this->has_tdom_hll = false;
  (this->filters).
  super_vector<duckdb::optional_ptr<duckdb::FilterInfo,_true>,_std::allocator<duckdb::optional_ptr<duckdb::FilterInfo,_true>_>_>
  .
  super__Vector_base<duckdb::optional_ptr<duckdb::FilterInfo,_true>,_std::allocator<duckdb::optional_ptr<duckdb::FilterInfo,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->filters).
  super_vector<duckdb::optional_ptr<duckdb::FilterInfo,_true>,_std::allocator<duckdb::optional_ptr<duckdb::FilterInfo,_true>_>_>
  .
  super__Vector_base<duckdb::optional_ptr<duckdb::FilterInfo,_true>,_std::allocator<duckdb::optional_ptr<duckdb::FilterInfo,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->filters).
  super_vector<duckdb::optional_ptr<duckdb::FilterInfo,_true>,_std::allocator<duckdb::optional_ptr<duckdb::FilterInfo,_true>_>_>
  .
  super__Vector_base<duckdb::optional_ptr<duckdb::FilterInfo,_true>,_std::allocator<duckdb::optional_ptr<duckdb::FilterInfo,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->column_names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->column_names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->column_names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

explicit RelationsToTDom(const column_binding_set_t &column_binding_set)
	    : equivalent_relations(column_binding_set), tdom_hll(0), tdom_no_hll(NumericLimits<idx_t>::Maximum()),
	      has_tdom_hll(false) {}